

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a9d::DataTransform<sptk::int24_t,_sptk::int24_t>::~DataTransform
          (DataTransform<sptk::int24_t,_sptk::int24_t> *this)

{
  DataTransform<sptk::int24_t,_sptk::int24_t> *in_RDI;
  
  ~DataTransform(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

~DataTransform() override {
  }